

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_writer.cc
# Opt level: O0

Status __thiscall
leveldb::log::Writer::EmitPhysicalRecord(Writer *this,RecordType t,char *ptr,size_t length)

{
  long *plVar1;
  bool bVar2;
  undefined4 in_register_00000034;
  undefined8 *puVar3;
  ulong in_R8;
  Status local_80;
  Slice local_78;
  Status local_68 [3];
  Slice local_50;
  undefined1 local_3d;
  uint32_t local_3c;
  char local_37 [3];
  uint32_t crc;
  undefined1 uStack_30;
  char buf [7];
  size_t length_local;
  char *ptr_local;
  RecordType t_local;
  Writer *this_local;
  Status *s;
  
  puVar3 = (undefined8 *)CONCAT44(in_register_00000034,t);
  if (0xffff < in_R8) {
    __assert_fail("length <= 0xffff",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_writer.cc"
                  ,0x54,
                  "Status leveldb::log::Writer::EmitPhysicalRecord(RecordType, const char *, size_t)"
                 );
  }
  if ((long)(*(int *)(puVar3 + 1) + 7) + in_R8 < 0x8001) {
    uStack_30 = (undefined1)in_R8;
    crc._1_1_ = uStack_30;
    buf[0] = (char)(in_R8 >> 8);
    crc._2_1_ = buf[0];
    ptr_local._4_1_ = SUB81(ptr,0);
    crc._3_1_ = ptr_local._4_1_;
    _uStack_30 = in_R8;
    local_3c = crc32c::Extend(*(uint32_t *)((long)puVar3 + ((ulong)ptr & 0xffffffff) * 4 + 0xc),
                              (char *)length,in_R8);
    local_3c = crc32c::Mask(local_3c);
    EncodeFixed32(local_37,local_3c);
    local_3d = 0;
    plVar1 = (long *)*puVar3;
    Slice::Slice(&local_50,local_37,7);
    (**(code **)(*plVar1 + 0x10))(this,plVar1,&local_50);
    bVar2 = Status::ok((Status *)this);
    if (bVar2) {
      plVar1 = (long *)*puVar3;
      Slice::Slice(&local_78,(char *)length,_uStack_30);
      (**(code **)(*plVar1 + 0x10))(local_68,plVar1,&local_78);
      Status::operator=((Status *)this,local_68);
      Status::~Status(local_68);
      bVar2 = Status::ok((Status *)this);
      if (bVar2) {
        (**(code **)(*(long *)*puVar3 + 0x20))(&local_80);
        Status::operator=((Status *)this,&local_80);
        Status::~Status(&local_80);
      }
    }
    *(int *)(puVar3 + 1) = *(int *)(puVar3 + 1) + (int)_uStack_30 + 7;
    return (Status)(char *)this;
  }
  __assert_fail("block_offset_ + kHeaderSize + length <= kBlockSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_writer.cc"
                ,0x55,
                "Status leveldb::log::Writer::EmitPhysicalRecord(RecordType, const char *, size_t)")
  ;
}

Assistant:

Status Writer::EmitPhysicalRecord(RecordType t, const char* ptr,
                                  size_t length) {
  assert(length <= 0xffff);  // Must fit in two bytes
  assert(block_offset_ + kHeaderSize + length <= kBlockSize);

  // Format the header
  char buf[kHeaderSize];
  buf[4] = static_cast<char>(length & 0xff);
  buf[5] = static_cast<char>(length >> 8);
  buf[6] = static_cast<char>(t);

  // Compute the crc of the record type and the payload.
  uint32_t crc = crc32c::Extend(type_crc_[t], ptr, length);
  crc = crc32c::Mask(crc);  // Adjust for storage
  EncodeFixed32(buf, crc);

  // Write the header and the payload
  Status s = dest_->Append(Slice(buf, kHeaderSize));
  if (s.ok()) {
    s = dest_->Append(Slice(ptr, length));
    if (s.ok()) {
      s = dest_->Flush();
    }
  }
  block_offset_ += kHeaderSize + length;
  return s;
}